

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar1 = (pIVar3->ClipRect).Min.y;
    fVar8 = (pIVar3->ClipRect).Max.y;
    fVar11 = fVar1;
    if (GImGui->NavMoveRequest == true) {
      fVar11 = (GImGui->NavScoringRectScreen).Min.y;
      fVar2 = (GImGui->NavScoringRectScreen).Max.y;
      if (fVar1 <= fVar11) {
        fVar11 = fVar1;
      }
      if (fVar8 < fVar2) {
        fVar8 = fVar2;
      }
    }
    fVar1 = (pIVar3->DC).CursorPos.y;
    auVar9._0_4_ = fVar8 - fVar1;
    auVar9._4_4_ = fVar11 - fVar1;
    auVar9._8_4_ = 0.0 - fVar1;
    auVar9._12_4_ = 0.0 - fVar1;
    auVar10._4_4_ = items_height;
    auVar10._0_4_ = items_height;
    auVar10._8_4_ = items_height;
    auVar10._12_4_ = items_height;
    auVar10 = divps(auVar9,auVar10);
    iVar6 = (int)auVar10._0_4_;
    iVar7 = (int)auVar10._4_4_;
    if (GImGui->NavMoveRequest != false) {
      iVar6 = iVar6 - ((int)-(uint)(GImGui->NavMoveClipDir == 3) >> 0x1f);
      iVar7 = iVar7 - (uint)(GImGui->NavMoveClipDir == 2);
    }
    iVar4 = items_count;
    if (iVar7 < items_count) {
      iVar4 = iVar7;
    }
    iVar5 = 0;
    if (-1 < iVar7) {
      iVar5 = iVar4;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 < items_count) {
      items_count = iVar6;
    }
    if (iVar6 < iVar5) {
      items_count = iVar5;
    }
    *out_items_display_start = iVar5;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRectScreen);

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}